

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::AddPackage
          (DescriptorBuilder *this,string_view name,Message *proto,FileDescriptor *file,
          bool toplevel)

{
  Tables *pTVar1;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  string_view element_name;
  string_view full_name;
  string_view full_name_00;
  string_view name_00;
  string_view full_name_01;
  string_view key;
  string_view element_name_00;
  FileDescriptor *pFVar2;
  bool bVar3;
  size_type sVar4;
  string_view haystack;
  anon_class_16_2_78785779 local_150;
  VoidPtr local_140;
  Invoker<std::__cxx11::basic_string<char>_> local_138;
  DescriptorBuilder *local_130;
  char *local_128;
  FileDescriptor *local_120;
  FileDescriptor *other_file;
  size_t local_110;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  DescriptorBuilder *local_e8;
  size_t local_e0;
  DescriptorBuilder *local_d8;
  size_t local_d0;
  size_type local_c8;
  size_type dot_pos;
  DescriptorBuilder *local_b8;
  char *local_b0;
  Subpackage *local_a8;
  Subpackage *package;
  string_view local_98;
  DescriptorBuilder *local_88;
  size_t local_80;
  Symbol local_78;
  Symbol existing_symbol;
  VoidPtr local_68;
  Invoker<std::__cxx11::basic_string<char>_> local_60;
  DescriptorBuilder *local_58;
  char *local_50;
  DescriptorBuilder *local_48;
  char *local_40;
  byte local_31;
  FileDescriptor *pFStack_30;
  bool toplevel_local;
  FileDescriptor *file_local;
  Message *proto_local;
  DescriptorBuilder *this_local;
  string_view name_local;
  
  local_40 = name._M_str;
  local_48 = (DescriptorBuilder *)name._M_len;
  haystack._M_str = (char *)0x0;
  haystack._M_len = (size_t)local_40;
  local_31 = toplevel;
  pFStack_30 = file;
  file_local = (FileDescriptor *)proto;
  proto_local = (Message *)this;
  this_local = local_48;
  name_local._M_len = (size_t)local_40;
  bVar3 = absl::lts_20250127::StrContains((lts_20250127 *)local_48,haystack,(char)proto);
  pFVar2 = file_local;
  if (bVar3) {
    local_58 = this_local;
    local_50 = (char *)name_local._M_len;
    existing_symbol.ptr_ = (SymbolBase *)&this_local;
    absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
    FunctionRef<google::protobuf::DescriptorBuilder::AddPackage(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::FileDescriptor*,bool)::__0,void>
              ((FunctionRef<std::__cxx11::string()> *)&local_68,
               (anon_class_8_1_898f2789 *)&existing_symbol);
    element_name_00._M_str = local_50;
    element_name_00._M_len = (size_t)local_58;
    make_error.invoker_ = local_60;
    make_error.ptr_.obj = local_68.obj;
    AddError(this,element_name_00,(Message *)pFVar2,NAME,make_error);
  }
  else {
    local_88 = this_local;
    local_80 = name_local._M_len;
    key._M_str = (char *)name_local._M_len;
    key._M_len = (size_t)this_local;
    local_78 = DescriptorPool::Tables::FindSymbol(this->tables_,key);
    bVar3 = Symbol::IsNull(&local_78);
    if (bVar3) {
      if ((local_31 & 1) == 0) {
        local_a8 = DescriptorPool::Tables::Allocate<google::protobuf::Symbol::Subpackage>
                             (this->tables_);
        sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
        local_a8->name_size = (int)sVar4;
        local_a8->file = pFStack_30;
        pTVar1 = this->tables_;
        local_b8 = this_local;
        local_b0 = (char *)name_local._M_len;
        Symbol::Symbol((Symbol *)&dot_pos,local_a8);
        full_name_01._M_str = local_b0;
        full_name_01._M_len = (size_t)local_b8;
        DescriptorPool::Tables::AddSymbol(pTVar1,full_name_01,(Symbol)dot_pos);
      }
      else {
        pTVar1 = this->tables_;
        local_98 = FileDescriptor::package(pFStack_30);
        Symbol::Symbol((Symbol *)&package,pFStack_30);
        DescriptorPool::Tables::AddSymbol(pTVar1,local_98,(Symbol)package);
      }
      local_c8 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                           ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,'.',
                            0xffffffffffffffff);
      if (local_c8 == 0xffffffffffffffff) {
        local_d8 = this_local;
        local_d0 = name_local._M_len;
        local_e8 = this_local;
        local_e0 = name_local._M_len;
        name_00._M_str = (char *)name_local._M_len;
        name_00._M_len = (size_t)this_local;
        full_name_00._M_str = (char *)name_local._M_len;
        full_name_00._M_len = (size_t)this_local;
        ValidateSymbolName(this,name_00,full_name_00,(Message *)file_local);
      }
      else {
        local_f8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                             ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,0,
                              local_c8);
        AddPackage(this,local_f8,(Message *)file_local,pFStack_30,false);
        local_108 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                              ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,
                               local_c8 + 1,0xffffffffffffffff);
        other_file = (FileDescriptor *)this_local;
        local_110 = name_local._M_len;
        full_name._M_str = (char *)name_local._M_len;
        full_name._M_len = (size_t)this_local;
        ValidateSymbolName(this,local_108,full_name,(Message *)file_local);
      }
    }
    else {
      bVar3 = Symbol::IsPackage(&local_78);
      if (!bVar3) {
        local_120 = Symbol::GetFile(&local_78);
        pFVar2 = file_local;
        local_130 = this_local;
        local_128 = (char *)name_local._M_len;
        local_150.name = (string_view *)&this_local;
        local_150.other_file = &local_120;
        absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
        FunctionRef<google::protobuf::DescriptorBuilder::AddPackage(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::FileDescriptor*,bool)::__1,void>
                  ((FunctionRef<std::__cxx11::string()> *)&local_140,&local_150);
        element_name._M_str = local_128;
        element_name._M_len = (size_t)local_130;
        make_error_00.invoker_ = local_138;
        make_error_00.ptr_.obj = local_140.obj;
        AddError(this,element_name,(Message *)pFVar2,NAME,make_error_00);
      }
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::AddPackage(const absl::string_view name,
                                   const Message& proto, FileDescriptor* file,
                                   bool toplevel) {
  if (absl::StrContains(name, '\0')) {
    AddError(name, proto, DescriptorPool::ErrorCollector::NAME, [&] {
      return absl::StrCat("\"", name, "\" contains null character.");
    });
    return;
  }

  Symbol existing_symbol = tables_->FindSymbol(name);
  // It's OK to redefine a package.
  if (existing_symbol.IsNull()) {
    if (toplevel) {
      // It is the toplevel package name, so insert the descriptor directly.
      tables_->AddSymbol(file->package(), Symbol(file));
    } else {
      auto* package = tables_->Allocate<Symbol::Subpackage>();
      // If the name is the package name, then it is already in the arena.
      // If not, copy it there. It came from the call to AddPackage below.
      package->name_size = static_cast<int>(name.size());
      package->file = file;
      tables_->AddSymbol(name, Symbol(package));
    }
    // Also add parent package, if any.
    std::string::size_type dot_pos = name.find_last_of('.');
    if (dot_pos == std::string::npos) {
      // No parents.
      ValidateSymbolName(name, name, proto);
    } else {
      // Has parent.
      AddPackage(name.substr(0, dot_pos), proto, file, false);
      ValidateSymbolName(name.substr(dot_pos + 1), name, proto);
    }
  } else if (!existing_symbol.IsPackage()) {
    // Symbol seems to have been defined in a different file.
    const FileDescriptor* other_file = existing_symbol.GetFile();
    AddError(name, proto, DescriptorPool::ErrorCollector::NAME, [&] {
      return absl::StrCat("\"", name,
                          "\" is already defined (as something other than "
                          "a package) in file \"",
                          (other_file == nullptr ? "null" : other_file->name()),
                          "\".");
    });
  }
}